

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  int iVar5;
  long lVar6;
  ImVec4 *pIVar7;
  ImDrawCmd *__dest;
  int iVar8;
  ImDrawCmd *pIVar9;
  int iVar10;
  void *pvVar11;
  
  lVar6 = (long)(this->_ClipRectStack).Size;
  pIVar7 = &GNullClipRect;
  if (lVar6 != 0) {
    pIVar7 = (this->_ClipRectStack).Data + lVar6 + -1;
  }
  fVar4 = pIVar7->x;
  uVar2 = pIVar7->y;
  uVar3 = pIVar7->z;
  lVar6 = (long)(this->_TextureIdStack).Size;
  if (lVar6 == 0) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar11 = (this->_TextureIdStack).Data[lVar6 + -1];
  }
  if ((fVar4 <= (float)uVar3) && (fVar1 = pIVar7->w, (float)uVar2 <= fVar1)) {
    iVar5 = (this->CmdBuffer).Size;
    if (iVar5 == (this->CmdBuffer).Capacity) {
      if (iVar5 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar5 / 2 + iVar5;
      }
      iVar10 = iVar5 + 1;
      if (iVar5 + 1 < iVar8) {
        iVar10 = iVar8;
      }
      __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar10 * 0x30);
      pIVar9 = (this->CmdBuffer).Data;
      if (pIVar9 == (ImDrawCmd *)0x0) {
        pIVar9 = (ImDrawCmd *)0x0;
      }
      else {
        memcpy(__dest,pIVar9,(long)(this->CmdBuffer).Size * 0x30);
        pIVar9 = (this->CmdBuffer).Data;
      }
      ImGui::MemFree(pIVar9);
      (this->CmdBuffer).Data = __dest;
      (this->CmdBuffer).Capacity = iVar10;
      iVar5 = (this->CmdBuffer).Size;
    }
    else {
      __dest = (this->CmdBuffer).Data;
    }
    (this->CmdBuffer).Size = iVar5 + 1;
    __dest[iVar5].ElemCount = 0;
    __dest[iVar5].ClipRect.x = fVar4;
    __dest[iVar5].ClipRect.y = (float)uVar2;
    __dest[iVar5].ClipRect.z = (float)uVar3;
    __dest[iVar5].ClipRect.w = fVar1;
    __dest[iVar5].TextureId = pvVar11;
    __dest[iVar5].UserCallback = (ImDrawCallback)0x0;
    (&__dest[iVar5].UserCallback)[1] = (ImDrawCallback)0x0;
    return;
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                ,0xa8,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = GetCurrentClipRect();
    draw_cmd.TextureId = GetCurrentTextureId();

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}